

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint64 tag,char *ptr,MessageLite *containing_type,
          InternalMetadata *metadata,ParseContext *ctx)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  int field_number;
  ExtensionFinder local_70;
  GeneratedExtensionFinder finder;
  ExtensionInfo extension;
  bool local_31 [8];
  bool was_packed_on_wire;
  
  local_70._vptr_ExtensionFinder = (_func_int **)&PTR__ExtensionFinder_001a4df0;
  field_number = (int)(tag >> 3);
  finder.super_ExtensionFinder._vptr_ExtensionFinder = (_func_int **)containing_type;
  bVar1 = FindExtensionInfoFromFieldNumber
                    (this,(uint)tag & 7,field_number,&local_70,
                     (ExtensionInfo *)&finder.containing_type_,local_31);
  if (bVar1) {
    pcVar2 = ParseFieldWithExtensionInfo<std::__cxx11::string>
                       (this,field_number,local_31[0],(ExtensionInfo *)&finder.containing_type_,
                        metadata,ptr,ctx);
  }
  else {
    if (((ulong)metadata->ptr_ & 1) == 0) {
      unknown = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>(metadata);
    }
    else {
      unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (((ulong)metadata->ptr_ & 0xfffffffffffffffe) + 8);
    }
    pcVar2 = UnknownFieldParse((uint)tag,unknown,ptr,ctx);
  }
  return pcVar2;
}

Assistant:

const char* ExtensionSet::ParseField(uint64 tag, const char* ptr,
                                     const MessageLite* containing_type,
                                     internal::InternalMetadata* metadata,
                                     internal::ParseContext* ctx) {
  GeneratedExtensionFinder finder(containing_type);
  int number = tag >> 3;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtensionInfoFromFieldNumber(tag & 7, number, &finder, &extension,
                                        &was_packed_on_wire)) {
    return UnknownFieldParse(
        tag, metadata->mutable_unknown_fields<std::string>(), ptr, ctx);
  }
  return ParseFieldWithExtensionInfo<std::string>(
      number, was_packed_on_wire, extension, metadata, ptr, ctx);
}